

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O1

Vec_Int_t * Vec_WecInsertLevel(Vec_Wec_t *p,int i)

{
  uint uVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar3 = (Vec_Int_t *)malloc(0x100);
      }
      else {
        pVVar3 = (Vec_Int_t *)realloc(p->pArray,0x100);
      }
      p->pArray = pVVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_00661582;
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar3 = (Vec_Int_t *)malloc((ulong)uVar1 << 5);
      }
      else {
        pVVar3 = (Vec_Int_t *)realloc(p->pArray,(ulong)uVar1 << 5);
      }
      p->pArray = pVVar3;
    }
    memset(pVVar3 + p->nCap,0,((long)iVar5 - (long)p->nCap) * 0x10);
    p->nCap = iVar5;
  }
LAB_00661582:
  iVar5 = p->nSize;
  uVar1 = iVar5 + 1;
  p->nSize = uVar1;
  if (-1 < iVar5) {
    pVVar3 = p->pArray;
    pVVar4 = pVVar3 + ((ulong)uVar1 - 2);
    while (pVVar3 <= pVVar4) {
      iVar5 = pVVar4->nSize;
      piVar2 = pVVar4->pArray;
      pVVar4[1].nCap = pVVar4->nCap;
      pVVar4[1].nSize = iVar5;
      pVVar4[1].pArray = piVar2;
      pVVar4 = pVVar4 + -1;
      pVVar3 = p->pArray;
    }
    pVVar3->nCap = 0;
    pVVar3->nSize = 0;
    pVVar3->pArray = (int *)0x0;
    return pVVar4;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x142,"Vec_Int_t *Vec_WecInsertLevel(Vec_Wec_t *, int)");
}

Assistant:

static inline Vec_Int_t * Vec_WecInsertLevel( Vec_Wec_t * p, int i )
{
    Vec_Int_t * pTemp;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WecGrow( p, 16 );
        else
            Vec_WecGrow( p, 2 * p->nCap );
    }
    ++p->nSize;
    assert( i >= 0 && i < p->nSize );
    for ( pTemp = p->pArray + p->nSize - 2; pTemp >= p->pArray + i; pTemp-- )
        pTemp[1] = pTemp[0];
    Vec_IntZero( p->pArray + i );
    return p->pArray + i;
}